

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode)

{
  uint uVar1;
  Fts5ExprNearset *pFVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    pFVar2 = pNode->pNear;
    uVar1 = pFVar2->nPhrase;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      (pFVar2->apPhrase[uVar4]->poslist).n = 0;
    }
  }
  else {
    for (lVar5 = 0; lVar5 < pNode->nChild; lVar5 = lVar5 + 1) {
      fts5ExprNodeZeroPoslist(pNode->apChild[lVar5]);
    }
  }
  return;
}

Assistant:

static void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pNode->pNear;
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      pPhrase->poslist.n = 0;
    }
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprNodeZeroPoslist(pNode->apChild[i]);
    }
  }
}